

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

cmTarget * __thiscall
cmMakefile::AddLibrary
          (cmMakefile *this,string *lname,TargetType type,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *srcs,bool excludeFromAll)

{
  bool bVar1;
  cmTarget *this_00;
  char *val;
  string local_48;
  
  if ((3 < type - STATIC_LIBRARY) && (type != INTERFACE_LIBRARY)) {
    __assert_fail("type == cmStateEnums::STATIC_LIBRARY || type == cmStateEnums::SHARED_LIBRARY || type == cmStateEnums::MODULE_LIBRARY || type == cmStateEnums::OBJECT_LIBRARY || type == cmStateEnums::INTERFACE_LIBRARY"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmMakefile.cxx"
                  ,0x7c7,
                  "cmTarget *cmMakefile::AddLibrary(const std::string &, cmStateEnums::TargetType, const std::vector<std::string> &, bool)"
                 );
  }
  this_00 = AddNewTarget(this,type,lname);
  cmTarget::ClearDependencyInformation(this_00,this);
  if (!excludeFromAll) {
    if (type == INTERFACE_LIBRARY) goto LAB_001c2f81;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"EXCLUDE_FROM_ALL","");
    val = GetProperty(this,&local_48);
    bVar1 = cmSystemTools::IsOn(val);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (!bVar1) goto LAB_001c2f81;
  }
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"EXCLUDE_FROM_ALL","");
  cmTarget::SetProperty(this_00,&local_48,"TRUE");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
LAB_001c2f81:
  cmTarget::AddSources(this_00,srcs);
  AddGlobalLinkInformation(this,this_00);
  return this_00;
}

Assistant:

cmTarget* cmMakefile::AddLibrary(const std::string& lname,
                                 cmStateEnums::TargetType type,
                                 const std::vector<std::string>& srcs,
                                 bool excludeFromAll)
{
  assert(type == cmStateEnums::STATIC_LIBRARY ||
         type == cmStateEnums::SHARED_LIBRARY ||
         type == cmStateEnums::MODULE_LIBRARY ||
         type == cmStateEnums::OBJECT_LIBRARY ||
         type == cmStateEnums::INTERFACE_LIBRARY);

  cmTarget* target = this->AddNewTarget(type, lname);
  // Clear its dependencies. Otherwise, dependencies might persist
  // over changes in CMakeLists.txt, making the information stale and
  // hence useless.
  target->ClearDependencyInformation(*this);
  if (excludeFromAll ||
      (type != cmStateEnums::INTERFACE_LIBRARY &&
       this->GetPropertyAsBool("EXCLUDE_FROM_ALL"))) {
    target->SetProperty("EXCLUDE_FROM_ALL", "TRUE");
  }
  target->AddSources(srcs);
  this->AddGlobalLinkInformation(*target);
  return target;
}